

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O3

void Fx_ManCreateLiterals(Fx_Man_t *p,int nVars)

{
  uint uVar1;
  uint *puVar2;
  int *piVar3;
  uint uVar4;
  int iVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  Vec_Wec_t *pVVar8;
  Vec_Int_t *pVVar9;
  void *pvVar10;
  int **ppiVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  Vec_Wec_t *pVVar18;
  int iVar19;
  long lVar20;
  
  p->nVars = 0;
  p->nLits = 0;
  pVVar18 = p->vCubes;
  iVar5 = pVVar18->nSize;
  uVar14 = (ulong)iVar5;
  if ((long)uVar14 < 1) {
    uVar4 = 0;
  }
  else {
    pVVar6 = pVVar18->pArray;
    iVar12 = 0;
    uVar4 = 0;
    uVar13 = 0;
    do {
      uVar1 = pVVar6[uVar13].nSize;
      if ((int)uVar1 < 1) {
        __assert_fail("Vec_IntSize(vCube) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcFx.c"
                      ,0x2d0,"void Fx_ManCreateLiterals(Fx_Man_t *, int)");
      }
      puVar2 = (uint *)pVVar6[uVar13].pArray;
      uVar17 = *puVar2;
      if ((int)uVar17 < (int)uVar4) {
        uVar17 = uVar4;
      }
      p->nVars = uVar17;
      iVar12 = iVar12 + uVar1 + -1;
      p->nLits = iVar12;
      uVar4 = uVar17;
      if ((ulong)uVar1 != 1) {
        uVar16 = 1;
        do {
          uVar17 = puVar2[uVar16];
          if ((int)uVar17 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          uVar17 = uVar17 >> 1;
          if ((int)uVar4 <= (int)uVar17) {
            uVar4 = uVar17;
          }
          p->nVars = uVar4;
          uVar16 = uVar16 + 1;
        } while (uVar1 != uVar16);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar14);
  }
  if (nVars <= (int)uVar4) {
    __assert_fail("p->nVars < nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcFx.c"
                  ,0x2d7,"void Fx_ManCreateLiterals(Fx_Man_t *, int)");
  }
  p->nVars = nVars;
  iVar12 = nVars * 2;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  uVar4 = nVars * 2 - 1;
  iVar19 = 0x10;
  if (0xe < uVar4) {
    iVar19 = iVar12;
  }
  pVVar6->nCap = iVar19;
  if (iVar19 == 0) {
    pVVar6->pArray = (int *)0x0;
    pVVar6->nSize = iVar12;
LAB_002cbee5:
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc((long)iVar19 << 2);
    pVVar6->pArray = piVar7;
    pVVar6->nSize = iVar12;
    if (piVar7 == (int *)0x0) goto LAB_002cbee5;
    memset(piVar7,0,(long)iVar12 << 2);
  }
  p->vCounts = pVVar6;
  if (0 < iVar5) {
    pVVar9 = pVVar18->pArray;
    uVar13 = 0;
    do {
      if (1 < pVVar9[uVar13].nSize) {
        piVar3 = pVVar9[uVar13].pArray;
        lVar15 = 1;
        do {
          iVar5 = piVar3[lVar15];
          if (((long)iVar5 < 0) || (iVar12 <= iVar5)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
          }
          piVar7[iVar5] = piVar7[iVar5] + 1;
          lVar15 = lVar15 + 1;
        } while (lVar15 < pVVar9[uVar13].nSize);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < uVar14);
  }
  pVVar8 = (Vec_Wec_t *)malloc(0x10);
  iVar5 = 8;
  if (6 < uVar4) {
    iVar5 = iVar12;
  }
  pVVar8->nCap = iVar5;
  if (iVar5 == 0) {
    pVVar9 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar9 = (Vec_Int_t *)calloc((long)iVar5,0x10);
  }
  pVVar8->pArray = pVVar9;
  pVVar8->nSize = iVar12;
  p->vLits = pVVar8;
  if (0 < nVars) {
    lVar15 = 8;
    lVar20 = 0;
    do {
      if (p->vLits->nSize <= lVar20) {
LAB_002cc1ea:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      iVar5 = pVVar6->pArray[lVar20];
      pVVar9 = p->vLits->pArray;
      if (*(int *)((long)pVVar9 + lVar15 + -8) < iVar5) {
        pvVar10 = *(void **)((long)&pVVar9->nCap + lVar15);
        if (pvVar10 == (void *)0x0) {
          pvVar10 = malloc((long)iVar5 << 2);
        }
        else {
          pvVar10 = realloc(pvVar10,(long)iVar5 << 2);
        }
        *(void **)((long)&pVVar9->nCap + lVar15) = pvVar10;
        if (pvVar10 == (void *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        *(int *)((long)pVVar9 + lVar15 + -8) = iVar5;
        pVVar6 = p->vCounts;
      }
      lVar20 = lVar20 + 1;
      lVar15 = lVar15 + 0x10;
    } while (lVar20 < pVVar6->nSize);
    pVVar18 = p->vCubes;
    uVar14 = (ulong)(uint)pVVar18->nSize;
  }
  if (0 < (int)uVar14) {
    lVar15 = 0;
    do {
      pVVar6 = pVVar18->pArray;
      if (1 < pVVar6[lVar15].nSize) {
        lVar20 = 1;
        do {
          uVar4 = pVVar6[lVar15].pArray[lVar20];
          pVVar18 = p->vLits;
          iVar5 = pVVar18->nSize;
          if (iVar5 <= (int)uVar4) {
            iVar19 = uVar4 + 1;
            iVar12 = iVar5 * 2;
            if (iVar5 * 2 <= iVar19) {
              iVar12 = iVar19;
            }
            iVar5 = pVVar18->nCap;
            if (iVar5 < iVar12) {
              if (pVVar18->pArray == (Vec_Int_t *)0x0) {
                pVVar9 = (Vec_Int_t *)malloc((long)iVar12 << 4);
              }
              else {
                pVVar9 = (Vec_Int_t *)realloc(pVVar18->pArray,(long)iVar12 << 4);
                iVar5 = pVVar18->nCap;
              }
              pVVar18->pArray = pVVar9;
              memset(pVVar9 + iVar5,0,(long)(iVar12 - iVar5) << 4);
              pVVar18->nCap = iVar12;
            }
            pVVar18->nSize = iVar19;
            iVar5 = iVar19;
          }
          if (((int)uVar4 < 0) || (iVar5 <= (int)uVar4)) goto LAB_002cc1ea;
          Vec_IntPush(pVVar18->pArray + uVar4,(int)lVar15);
          lVar20 = lVar20 + 1;
        } while (lVar20 < pVVar6[lVar15].nSize);
        pVVar18 = p->vCubes;
      }
      lVar15 = lVar15 + 1;
      uVar14 = (ulong)pVVar18->nSize;
    } while (lVar15 < (long)uVar14);
  }
  iVar5 = p->nVars;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  iVar12 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar12 = iVar5;
  }
  pVVar6->nCap = iVar12;
  if (iVar12 == 0) {
    pVVar6->pArray = (int *)0x0;
    pVVar6->nSize = iVar5;
  }
  else {
    piVar7 = (int *)malloc((long)iVar12 << 2);
    pVVar6->pArray = piVar7;
    pVVar6->nSize = iVar5;
    if (piVar7 != (int *)0x0) {
      memset(piVar7,0xff,(long)iVar5 << 2);
      uVar14 = (ulong)(uint)pVVar18->nSize;
      goto LAB_002cc187;
    }
  }
  piVar7 = (int *)0x0;
LAB_002cc187:
  p->vVarCube = pVVar6;
  if (0 < (int)uVar14) {
    ppiVar11 = &pVVar18->pArray->pArray;
    lVar15 = 0;
    do {
      if (*(int *)((long)ppiVar11 + -4) < 1) {
LAB_002cc247:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      lVar20 = (long)**ppiVar11;
      if ((lVar20 < 0) || (pVVar6->nSize <= **ppiVar11)) goto LAB_002cc247;
      if (piVar7[lVar20] == -1) {
        piVar7[lVar20] = (int)lVar15;
        uVar14 = (ulong)(uint)pVVar18->nSize;
      }
      lVar15 = lVar15 + 1;
      ppiVar11 = ppiVar11 + 2;
    } while (lVar15 < (int)uVar14);
  }
  return;
}

Assistant:

void Fx_ManCreateLiterals( Fx_Man_t * p, int nVars )
{
    Vec_Int_t * vCube;
    int i, k, Lit, Count;
    // find the number of variables
    p->nVars = p->nLits = 0;
    Vec_WecForEachLevel( p->vCubes, vCube, i )
    {
        assert( Vec_IntSize(vCube) > 0 );
        p->nVars = Abc_MaxInt( p->nVars, Vec_IntEntry(vCube, 0) );
        p->nLits += Vec_IntSize(vCube) - 1;
        Vec_IntForEachEntryStart( vCube, Lit, k, 1 )
            p->nVars = Abc_MaxInt( p->nVars, Abc_Lit2Var(Lit) );
    }
//    p->nVars++;
    assert( p->nVars < nVars );
    p->nVars = nVars;
    // count literals
    p->vCounts = Vec_IntStart( 2*p->nVars );
    Vec_WecForEachLevel( p->vCubes, vCube, i )
        Vec_IntForEachEntryStart( vCube, Lit, k, 1 )
            Vec_IntAddToEntry( p->vCounts, Lit, 1 );
    // start literals
    p->vLits = Vec_WecStart( 2*p->nVars );
    Vec_IntForEachEntry( p->vCounts, Count, Lit )
        Vec_IntGrow( Vec_WecEntry(p->vLits, Lit), Count );
    // fill out literals
    Vec_WecForEachLevel( p->vCubes, vCube, i )
        Vec_IntForEachEntryStart( vCube, Lit, k, 1 )
            Vec_WecPush( p->vLits, Lit, i );
    // create mapping of variable into the first cube
    p->vVarCube = Vec_IntStartFull( p->nVars );
    Vec_WecForEachLevel( p->vCubes, vCube, i )
        if ( Vec_IntEntry(p->vVarCube, Vec_IntEntry(vCube, 0)) == -1 )
            Vec_IntWriteEntry( p->vVarCube, Vec_IntEntry(vCube, 0), i );
}